

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observer.cc
# Opt level: O2

CoordTopocentric * __thiscall
Observer::GetLookAngle(CoordTopocentric *__return_storage_ptr__,Observer *this,Eci *eci)

{
  double dVar1;
  DateTime local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  local_98.m_encoded = (eci->m_dt).m_encoded;
  Update(this,&local_98);
  local_90 = (eci->m_velocity).x - (this->m_eci).m_velocity.x;
  local_80 = (eci->m_velocity).y - (this->m_eci).m_velocity.y;
  local_88 = (eci->m_velocity).z - (this->m_eci).m_velocity.z;
  local_38 = (eci->m_position).x - (this->m_eci).m_position.x;
  local_40 = (eci->m_position).y - (this->m_eci).m_position.y;
  local_48 = (eci->m_position).z - (this->m_eci).m_position.z;
  local_68 = SQRT(local_48 * local_48 + local_38 * local_38 + local_40 * local_40);
  local_98.m_encoded = (eci->m_dt).m_encoded;
  local_30 = DateTime::ToLocalMeanSiderealTime(&local_98,(this->m_geo).longitude);
  local_58 = sin((this->m_geo).latitude);
  local_60 = cos((this->m_geo).latitude);
  local_50 = sin(local_30);
  local_30 = cos(local_30);
  local_78 = (local_58 * local_30 * local_38 + local_58 * local_50 * local_40) - local_60 * local_48
  ;
  dVar1 = atan(-(local_40 * local_30 - local_50 * local_38) / local_78);
  dVar1 = (double)(-(ulong)(0.0 < local_78) & (ulong)(dVar1 + 3.141592653589793) |
                  ~-(ulong)(0.0 < local_78) & (ulong)dVar1);
  local_78 = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar1 |
                     (ulong)(dVar1 + 6.283185307179586) & -(ulong)(dVar1 < 0.0));
  uStack_70 = 0;
  dVar1 = asin((local_58 * local_48 +
               local_30 * local_60 * local_38 + local_60 * local_50 * local_40) / local_68);
  __return_storage_ptr__->azimuth = local_78;
  __return_storage_ptr__->elevation = dVar1;
  __return_storage_ptr__->range = local_68;
  __return_storage_ptr__->range_rate =
       (local_48 * local_88 + local_38 * local_90 + local_40 * local_80) / local_68;
  return __return_storage_ptr__;
}

Assistant:

CoordTopocentric Observer::GetLookAngle(const Eci &eci)
{
    /*
     * update the observers Eci to match the time of the Eci passed in
     * if necessary
     */
    Update(eci.GetDateTime());

    /*
     * calculate differences
     */
    Vector range_rate = eci.Velocity() - m_eci.Velocity();
    Vector range = eci.Position() - m_eci.Position();

    range.w = range.Magnitude();

    /*
     * Calculate Local Mean Sidereal Time for observers longitude
     */
    double theta = eci.GetDateTime().ToLocalMeanSiderealTime(m_geo.longitude);

    double sin_lat = sin(m_geo.latitude);
    double cos_lat = cos(m_geo.latitude);
    double sin_theta = sin(theta);
    double cos_theta = cos(theta);

    double top_s = sin_lat * cos_theta * range.x
        + sin_lat * sin_theta * range.y - cos_lat * range.z;
    double top_e = -sin_theta * range.x
        + cos_theta * range.y;
    double top_z = cos_lat * cos_theta * range.x 
        + cos_lat * sin_theta * range.y + sin_lat * range.z;
    double az = atan(-top_e / top_s);

    if (top_s > 0.0)
    {
        az += kPI;
    }

    if (az < 0.0)
    {
        az += 2.0 * kPI;
    }

    double el = asin(top_z / range.w);
    double rate = range.Dot(range_rate) / range.w;

    /*
     * azimuth in radians
     * elevation in radians
     * range in km
     * range rate in km/s
     */
    return CoordTopocentric(az,
            el,
            range.w,
            rate);
}